

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# support.h
# Opt level: O0

int asmjit::v1_14::Support::compareStringViews(char *aData,size_t aSize,char *bData,size_t bSize)

{
  ulong local_58;
  int c;
  size_t i;
  size_t size;
  size_t bSize_local;
  char *bData_local;
  size_t aSize_local;
  char *aData_local;
  
  local_58 = aSize;
  if (bSize < aSize) {
    local_58 = bSize;
  }
  i = 0;
  while( true ) {
    if (local_58 <= i) {
      return (int)aSize - (int)bSize;
    }
    if ((uint)(byte)aData[i] - (uint)(byte)bData[i] != 0) break;
    i = i + 1;
  }
  return (uint)(byte)aData[i] - (uint)(byte)bData[i];
}

Assistant:

static ASMJIT_FORCE_INLINE int compareStringViews(const char* aData, size_t aSize, const char* bData, size_t bSize) noexcept {
  size_t size = Support::min(aSize, bSize);

  for (size_t i = 0; i < size; i++) {
    int c = int(uint8_t(aData[i])) - int(uint8_t(bData[i]));
    if (c != 0)
      return c;
  }

  return int(aSize) - int(bSize);
}